

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_FuncCheckMajority(Gem_Man_t *p,int f)

{
  Gem_Obj_t *pGVar1;
  word *pwVar2;
  sbyte sVar3;
  uint uVar4;
  int m;
  uint uVar5;
  uint uVar6;
  int Seen;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int Polar;
  
  pGVar1 = p->pObjs;
  pwVar2 = Vec_MemReadEntry(p->vTtMem,f);
  uVar6 = *(uint *)(pGVar1 + f) & 0xf;
  uVar9 = 0;
  Polar = 0;
  uVar7 = 0;
  do {
    uVar5 = (uint)uVar9;
    if (uVar5 >> (sbyte)uVar6 != 0) {
      if (Polar != 0xffffffff) {
        printf("Found symmetric %d-variable function: ",(ulong)uVar6);
        Extra_PrintBinary2(_stdout,(uint *)&Polar,(*(uint *)(pGVar1 + f) & 0xf) + 1);
        printf("   ");
        if (((*(uint *)(pGVar1 + f) & 1) == 0) ||
           (sVar3 = (sbyte)(uVar6 + 1 >> 1),
           Polar != (int)(0xffffffffffffffff >> (-sVar3 & 0x3fU)) << sVar3)) {
          putchar(10);
        }
        else {
          printf("This is majority-%d.\n",(ulong)(*(uint *)(pGVar1 + f) & 0xf));
        }
      }
      return 0;
    }
    uVar9 = pwVar2[uVar9 >> 6] >> ((byte)uVar9 & 0x3f);
    uVar4 = 0;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      uVar4 = uVar4 + ((uVar5 >> (uVar10 & 0x1f) & 1) != 0);
    }
    uVar8 = (uint)uVar9 & 1;
    uVar10 = 1 << ((byte)uVar4 & 0x1f);
    if ((uVar7 >> (uVar4 & 0x1f) & 1) == 0) {
      uVar7 = uVar7 | uVar10;
      if ((uVar9 & 1) == 0) {
        uVar10 = uVar8;
      }
      Polar = Polar | uVar10;
    }
    else if (uVar8 != (((uint)Polar >> (uVar4 & 0x1f) & 1) != 0)) {
      return 0;
    }
    uVar9 = (ulong)(uVar5 + 1);
  } while( true );
}

Assistant:

int Gem_FuncCheckMajority( Gem_Man_t * p, int f )
{
    Gem_Obj_t * pObj = p->pObjs + f;
    word * pTruth = Vec_MemReadEntry( p->vTtMem, f );
    int Polar = Abc_TtIsFullySymmetric( pTruth, pObj->nVars );
    if ( Polar != -1 )
    {
        int nHalfVars = (pObj->nVars+1) >> 1;
        int Mask = Abc_Tt6Mask( nHalfVars );
        printf( "Found symmetric %d-variable function: ", pObj->nVars );
        Extra_PrintBinary2( stdout, (unsigned *)&Polar, pObj->nVars + 1 );
        printf( "   " );
        if ( (pObj->nVars & 1) && Polar == (Mask << nHalfVars) )
        {
            printf( "This is majority-%d.\n", pObj->nVars );
            return 0;
        }
        printf( "\n" );
    }
    return 0;
}